

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cpp
# Opt level: O1

int main(void)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  byte bVar5;
  char *__function;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  uint8_t buff [5];
  undefined4 local_10;
  undefined1 local_c;
  byte local_b [3];
  
  local_c = 1;
  local_10 = 0x807f8080;
  uVar6 = 0;
  uVar9 = 0xffffff80;
  bVar5 = 7;
  pbVar4 = local_b;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    if ((uint)lVar10 == 4) goto LAB_001011bf;
    bVar3 = *(byte *)((long)&local_10 + lVar10 + 1);
    uVar6 = uVar6 | (bVar3 & 0x7f) << (bVar5 & 0x1f);
    uVar8 = -0x80 << (bVar5 & 0x1f);
    if (bVar3 < 0x40) {
      uVar8 = 0;
    }
    bVar5 = bVar5 + 7;
    lVar11 = lVar10 + 1;
  } while ((char)bVar3 < '\0');
  uVar9 = (ulong)(uVar8 | uVar6);
  pbVar4 = (byte *)((long)&local_10 + lVar10 + 2);
LAB_001011bf:
  if ((uint)lVar10 < 4) {
    pbVar1 = pbVar4 + 1;
    uVar6 = *pbVar4 & 0x7f;
    uVar7 = (ulong)uVar6;
    if ((char)*pbVar4 < '\0') {
      pbVar4 = pbVar4 + 5;
      bVar5 = 7;
      lVar11 = 0;
      do {
        uVar8 = (uint)lVar11;
        if (uVar8 == 4) goto LAB_0010121e;
        pbVar2 = pbVar1 + lVar11;
        uVar6 = uVar6 | (*pbVar2 & 0x7f) << (bVar5 & 0x1f);
        lVar11 = lVar11 + 1;
        bVar5 = bVar5 + 7;
      } while ((char)*pbVar2 < '\0');
      uVar7 = (ulong)uVar6;
      pbVar4 = pbVar1 + lVar11;
LAB_0010121e:
      bVar12 = 3 < uVar8;
    }
    else {
      bVar12 = false;
      pbVar4 = pbVar1;
    }
    if (!bVar12) {
      printf("s1: %x; u1: %x; buff: %p; p: %p\n",uVar9,uVar7,&local_10,pbVar4);
      return 0;
    }
    __function = "T parse_leb128(const uint8_t *&) [T = unsigned int]";
  }
  else {
    __function = "T parse_leb128(const uint8_t *&) [T = int]";
  }
  __assert_fail("0 && \"LEB128 encoding too long\"",
                "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/leb128/leb128.cpp"
                ,0x1a,__function);
}

Assistant:

static inline T parse_leb128(const uint8_t *&Addr)
{
    typedef typename std::make_unsigned<T>::type uT;
    uT v = 0;
    for (int i = 0;i < ((sizeof(T) * 8 - 1) / 7 + 1);i++) {
        uint8_t a = *Addr;
        Addr++;
        v |= uT(a & 0x7f) << (i * 7);
        if ((a & 0x80) == 0) {
            if (a & 0x40 && std::is_signed<T>::value) {
                int valid_bits = (i + 1) * 7;
                if (valid_bits < 64) {
                    v |= -(uT(1) << valid_bits);
                }
            }
            return T(v);
        }
    }
    assert(0 && "LEB128 encoding too long");
    return T(v);
}